

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_ASAi_dns.c
# Opt level: O1

int resB(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector yyB,N_Vector ypB,N_Vector rrB,
        void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dStack_c0;
  double dStack_b0;
  double local_78;
  
  dVar27 = *user_dataB;
  dVar1 = *(double *)((long)user_dataB + 8);
  dVar28 = *(double *)((long)user_dataB + 0x10);
  pdVar16 = *(double **)((long)yy->content + 0x10);
  dVar2 = *pdVar16;
  dVar29 = pdVar16[1];
  dVar32 = pdVar16[5];
  pdVar17 = *(double **)((long)yyB->content + 0x10);
  pdVar18 = *(double **)((long)ypB->content + 0x10);
  dVar3 = *pdVar18;
  dVar30 = dVar2 * dVar2 * dVar2;
  dVar31 = dVar1 / *(double *)((long)user_dataB + 0x20);
  dVar24 = pdVar16[4] * dVar31;
  dVar22 = *(double *)((long)user_dataB + 0x18) * dVar32;
  auVar14 = *(undefined1 (*) [16])(pdVar17 + 2);
  dVar21 = auVar14._8_8_;
  auVar19._8_4_ = auVar14._0_4_;
  auVar19._0_8_ = dVar21;
  auVar19._12_4_ = auVar14._4_4_;
  auVar15 = *(undefined1 (*) [16])(pdVar17 + 4);
  dVar33 = auVar15._0_8_;
  dVar34 = auVar15._8_8_;
  auVar20._8_4_ = auVar15._0_4_;
  auVar20._0_8_ = dVar34;
  auVar20._12_4_ = auVar15._4_4_;
  dVar4 = *(double *)((long)user_dataB + 0x28);
  dVar5 = *(double *)((long)user_dataB + 0x30);
  dVar6 = pdVar16[2];
  dVar7 = pdVar16[3];
  dVar8 = *pdVar17;
  dVar9 = pdVar17[1];
  dVar10 = pdVar18[1];
  dVar11 = pdVar18[2];
  dVar12 = pdVar18[3];
  dVar13 = pdVar18[4];
  if (dVar29 < 0.0) {
    dVar23 = sqrt(dVar29);
  }
  else {
    dVar23 = SQRT(dVar29);
  }
  dVar25 = dVar7 * dVar7 * dVar28;
  dVar26 = (dVar23 / dVar29) * dVar30 * dVar27 * dVar2;
  dVar30 = dVar27 * dVar30 * dVar23;
  dVar27 = dVar32 * dVar22 * (dVar23 / dVar29);
  local_78 = auVar14._0_8_;
  dVar32 = dVar28 * dVar2 * dVar7;
  dVar29 = dVar32 * -2.0;
  dVar28 = (dVar8 - local_78) - dVar21;
  dVar6 = dVar6 * dVar1;
  dStack_b0 = auVar19._8_8_;
  dStack_c0 = auVar20._8_8_;
  pdVar16 = *(double **)((long)rrB->content + 0x10);
  *pdVar16 = dVar7 * dVar5 * dVar34 +
             dVar25 * -2.0 * dVar21 +
             (dVar21 - dVar33) * dVar24 +
             local_78 * (dVar30 * 4.0 + dVar24) +
             (((dVar3 + 1.0) - (dVar30 * 8.0 + dVar24 + dVar25) * dVar8) -
             (dVar30 + dVar30 + dVar25) * dVar9);
  pdVar16[1] = dVar27 * 0.5 * dStack_c0 +
               dVar26 * 0.5 * dStack_b0 +
               dVar9 * -(dVar4 + dVar26 * 0.25 + dVar27 * 0.25) + dVar8 * -dVar26 + dVar10;
  pdVar16[2] = (dVar33 + dVar28) * dVar7 * dVar1 + dVar11;
  pdVar16[3] = dVar34 * dVar2 * dVar5 +
               dVar6 * dVar33 +
               (((dVar29 * dVar9 + (dVar29 + dVar6) * dVar8 + dVar12) - local_78 * dVar6) -
               (dVar32 * 4.0 + dVar6) * dVar21);
  pdVar16[4] = -dVar31 * dVar2 * (dVar28 + dVar33) + dVar13;
  pdVar16[5] = dVar23 * dVar22 * ((dVar33 + dVar33) - dVar9) + -dVar34;
  return 0;
}

Assistant:

static int resB(sunrealtype tt, N_Vector yy, N_Vector yp, N_Vector yyB,
                N_Vector ypB, N_Vector rrB, void* user_dataB)
{
  UserData data;

  sunrealtype y1, y2, y3, y4, y5, y6;

  sunrealtype yB1, yB2, yB3, yB4, yB5, yB6;
  sunrealtype ypB1, ypB2, ypB3, ypB4, ypB5;

  sunrealtype k1, k2, k3, k4;
  sunrealtype K, klA, Ks;

  sunrealtype y2tohalf, y1to3, k2overK, tmp1, tmp2;

  data = (UserData)user_dataB;
  k1   = data->k1;
  k2   = data->k2;
  k3   = data->k3;
  k4   = data->k4;
  K    = data->K;
  klA  = data->klA;
  Ks   = data->Ks;

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);
  y4 = Ith(yy, 4);
  y5 = Ith(yy, 5);
  y6 = Ith(yy, 6);

  yB1 = Ith(yyB, 1);
  yB2 = Ith(yyB, 2);
  yB3 = Ith(yyB, 3);
  yB4 = Ith(yyB, 4);
  yB5 = Ith(yyB, 5);
  yB6 = Ith(yyB, 6);

  ypB1 = Ith(ypB, 1);
  ypB2 = Ith(ypB, 2);
  ypB3 = Ith(ypB, 3);
  ypB4 = Ith(ypB, 4);
  ypB5 = Ith(ypB, 5);

  y2tohalf = sqrt(y2);
  y1to3    = y1 * y1 * y1;
  k2overK  = k2 / K;

  tmp1        = k1 * y1to3 * y2tohalf;
  tmp2        = k3 * y4 * y4;
  Ith(rrB, 1) = 1 + ypB1 - (EIGHT * tmp1 + k2overK * y5 + tmp2) * yB1 -
                (TWO * tmp1 + tmp2) * yB2 + (FOUR * tmp1 + k2overK * y5) * yB3 +
                k2overK * y5 * (yB4 - yB5) - TWO * tmp2 * yB4 + Ks * y4 * yB6;

  tmp1        = k1 * y1 * y1to3 * (y2tohalf / y2);
  tmp2        = k4 * y6 * y6 * (y2tohalf / y2);
  Ith(rrB, 2) = ypB2 - tmp1 * yB1 -
                (QUARTER * tmp1 + QUARTER * tmp2 + klA) * yB2 +
                HALF * tmp1 * yB3 + HALF * tmp2 * yB5;

  Ith(rrB, 3) = ypB3 + k2 * y4 * (yB1 - yB3 - yB4 + yB5);

  tmp1 = k3 * y1 * y4;
  tmp2 = k2 * y3;
  Ith(rrB, 4) = ypB4 + (tmp2 - TWO * tmp1) * yB1 - TWO * tmp1 * yB2 - tmp2 * yB3 -
                (tmp2 + FOUR * tmp1) * yB4 + tmp2 * yB5 + Ks * y1 * yB6;

  Ith(rrB, 5) = ypB5 - k2overK * y1 * (yB1 - yB3 - yB4 + yB5);

  Ith(rrB, 6) = k4 * y6 * y2tohalf * (2 * yB5 - yB2) - yB6;

  return 0;
}